

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelogger.c
# Opt level: O0

void consolelogger_log(LOG_CATEGORY log_category,char *file,char *func,int line,uint options,
                      char *format,...)

{
  char in_AL;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *local_110;
  undefined1 local_108 [48];
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined4 local_58;
  undefined4 local_54;
  va_list args;
  char *timeString;
  time_t t;
  char *format_local;
  uint options_local;
  int line_local;
  char *func_local;
  char *file_local;
  LOG_CATEGORY log_category_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  local_54 = 0x30;
  local_58 = 0x30;
  t = (time_t)format;
  format_local._0_4_ = options;
  format_local._4_4_ = line;
  _options_local = func;
  func_local = file;
  file_local._4_4_ = log_category;
  timeString = (char *)get_time((time_t *)0x0);
  local_110 = get_ctime((time_t *)&timeString);
  if (local_110 == (char *)0x0) {
    local_110 = "<NO TIME IMPL>";
  }
  args[0].reg_save_area = local_110;
  if (file_local._4_4_ == AZ_LOG_ERROR) {
    printf("Error: Time:%.24s File:%s Func:%s Line:%d ",local_110,func_local,_options_local,
           (ulong)format_local._4_4_);
  }
  else if (file_local._4_4_ == AZ_LOG_INFO) {
    printf("Info: ");
  }
  vprintf((char *)t,&local_58);
  if (((uint)format_local & 1) != 0) {
    printf("\r\n");
  }
  return;
}

Assistant:

__attribute__ ((format (printf, 6, 7)))
#endif
void consolelogger_log(LOG_CATEGORY log_category, const char* file, const char* func, int line, unsigned int options, const char* format, ...)
{
    time_t t;
    char* timeString;
    va_list args;
    va_start(args, format);

#if LOGGER_DISABLE_PAL
    t = time(NULL);
    timeString = ctime(&t);
#else  // LOGGER_DISABLE_PAL
    t = get_time(NULL);
    timeString = get_ctime(&t);
#endif // LOGGER_DISABLE_PAL

    // In case time is not implemented
    timeString = timeString == NULL ? "<NO TIME IMPL>" : timeString;

    switch (log_category)
    {
    case AZ_LOG_INFO:
        (void)printf("Info: ");
        break;
    case AZ_LOG_ERROR:
        (void)printf("Error: Time:%.24s File:%s Func:%s Line:%d ", timeString, file, func, line);
        break;
    default:
        break;
    }

    (void)vprintf(format, args);
    va_end(args);

    (void)log_category;
    if (options & LOG_LINE)
    {
        (void)printf("\r\n");
    }
}